

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O2

void secp256k1_modinv64_update_de_62
               (secp256k1_modinv64_signed62 *d,secp256k1_modinv64_signed62 *e,
               secp256k1_modinv64_trans2x2 *t,secp256k1_modinv64_modinfo *modinfo)

{
  long lVar1;
  ulong uVar2;
  secp256k1_modinv64_signed62 *a;
  secp256k1_modinv64_signed62 *a_00;
  secp256k1_modinv64_modinfo *psVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  undefined8 uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  secp256k1_int128 cd;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  long local_a8;
  secp256k1_modinv64_signed62 *local_a0;
  secp256k1_modinv64_signed62 *local_98;
  secp256k1_modinv64_modinfo *local_90;
  secp256k1_int128 ce;
  int64_t local_78;
  int64_t local_70;
  int64_t local_68;
  int64_t local_60;
  int64_t local_58;
  int64_t local_50;
  int64_t local_48;
  int64_t local_40;
  int64_t local_38;
  
  iVar7 = d->v[0];
  local_58 = d->v[1];
  local_48 = d->v[2];
  iVar5 = d->v[3];
  local_78 = d->v[4];
  local_a8 = e->v[0];
  local_50 = e->v[1];
  local_40 = e->v[2];
  uVar13 = t->u;
  uVar9 = t->v;
  local_b8 = t->q;
  local_b0 = t->r;
  local_38 = e->v[3];
  local_70 = e->v[4];
  iVar4 = secp256k1_modinv64_mul_cmp_62(d,5,&modinfo->modulus,-2);
  if (iVar4 < 1) {
    pcVar12 = 
    "test condition failed: secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0";
    uVar8 = 0x1a2;
  }
  else {
    iVar4 = secp256k1_modinv64_mul_cmp_62(d,5,&modinfo->modulus,1);
    if (iVar4 < 0) {
      iVar4 = secp256k1_modinv64_mul_cmp_62(e,5,&modinfo->modulus,-2);
      if (iVar4 < 1) {
        pcVar12 = 
        "test condition failed: secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0";
        uVar8 = 0x1a4;
      }
      else {
        iVar4 = secp256k1_modinv64_mul_cmp_62(e,5,&modinfo->modulus,1);
        if (iVar4 < 0) {
          local_90 = modinfo;
          local_68 = iVar5;
          iVar5 = secp256k1_modinv64_abs(uVar13);
          iVar6 = secp256k1_modinv64_abs(uVar9);
          uVar2 = local_b8;
          if (0x4000000000000000 - iVar6 < iVar5) {
            pcVar12 = 
            "test condition failed: secp256k1_modinv64_abs(u) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(v))"
            ;
            uVar8 = 0x1a6;
          }
          else {
            local_c0 = uVar9;
            local_60 = iVar7;
            iVar5 = secp256k1_modinv64_abs(local_b8);
            uVar9 = local_b0;
            iVar6 = secp256k1_modinv64_abs(local_b0);
            iVar7 = local_60;
            lVar1 = local_a8;
            if (0x4000000000000000 - iVar6 < iVar5) {
              pcVar12 = 
              "test condition failed: secp256k1_modinv64_abs(q) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(r))"
              ;
              uVar8 = 0x1a7;
            }
            else {
              lVar10 = (local_c0 & local_70 >> 0x3f) + (uVar13 & local_78 >> 0x3f);
              lVar11 = (local_70 >> 0x3f & uVar9) + (local_78 >> 0x3f & uVar2);
              cd._0_8_ = uVar13 * local_60;
              cd._8_8_ = SUB168(SEXT816((long)uVar13) * SEXT816(local_60),8);
              local_a0 = d;
              local_98 = e;
              secp256k1_i128_accum_mul(&cd,local_c0,local_a8);
              ce._0_8_ = uVar2 * iVar7;
              ce._8_8_ = SUB168(SEXT816((long)uVar2) * SEXT816(iVar7),8);
              secp256k1_i128_accum_mul(&ce,uVar9,lVar1);
              psVar3 = local_90;
              local_a8 = lVar10 - ((ulong)cd * local_90->modulus_inv62 + lVar10 & 0x3fffffffffffffff
                                  );
              lVar11 = lVar11 - (local_90->modulus_inv62 * (ulong)ce + lVar11 & 0x3fffffffffffffff);
              secp256k1_i128_accum_mul(&cd,(local_90->modulus).v[0],local_a8);
              secp256k1_i128_accum_mul(&ce,(psVar3->modulus).v[0],lVar11);
              iVar7 = local_58;
              if (((ulong)cd & 0x3fffffffffffffff) == 0) {
                cd._0_8_ = (ulong)cd >> 0x3e | cd._8_8_ << 2;
                cd._8_8_ = cd._8_8_ >> 0x3e;
                if (((ulong)ce & 0x3fffffffffffffff) == 0) {
                  ce._0_8_ = (ulong)ce >> 0x3e | ce._8_8_ << 2;
                  ce._8_8_ = ce._8_8_ >> 0x3e;
                  secp256k1_i128_accum_mul(&cd,uVar13,local_58);
                  iVar5 = local_50;
                  secp256k1_i128_accum_mul(&cd,local_c0,local_50);
                  secp256k1_i128_accum_mul(&ce,local_b8,iVar7);
                  secp256k1_i128_accum_mul(&ce,local_b0,iVar5);
                  psVar3 = local_90;
                  lVar10 = local_a8;
                  lVar1 = (local_90->modulus).v[1];
                  if (lVar1 != 0) {
                    secp256k1_i128_accum_mul(&cd,lVar1,local_a8);
                    secp256k1_i128_accum_mul(&ce,(psVar3->modulus).v[1],lVar11);
                  }
                  iVar7 = local_48;
                  local_a0->v[0] = (ulong)cd & 0x3fffffffffffffff;
                  cd._0_8_ = (ulong)cd >> 0x3e | cd._8_8_ << 2;
                  cd._8_8_ = cd._8_8_ >> 0x3e;
                  uVar9 = (ulong)ce & 0x3fffffffffffffff;
                  ce._0_8_ = (ulong)ce >> 0x3e | ce._8_8_ << 2;
                  local_98->v[0] = uVar9;
                  ce._8_8_ = ce._8_8_ >> 0x3e;
                  secp256k1_i128_accum_mul(&cd,uVar13,local_48);
                  iVar5 = local_40;
                  psVar3 = local_90;
                  secp256k1_i128_accum_mul(&cd,local_c0,local_40);
                  secp256k1_i128_accum_mul(&ce,local_b8,iVar7);
                  secp256k1_i128_accum_mul(&ce,local_b0,iVar5);
                  lVar1 = (psVar3->modulus).v[2];
                  if (lVar1 != 0) {
                    secp256k1_i128_accum_mul(&cd,lVar1,lVar10);
                    secp256k1_i128_accum_mul(&ce,(psVar3->modulus).v[2],lVar11);
                  }
                  iVar7 = local_68;
                  local_a0->v[1] = (ulong)cd & 0x3fffffffffffffff;
                  cd._0_8_ = (ulong)cd >> 0x3e | cd._8_8_ << 2;
                  cd._8_8_ = cd._8_8_ >> 0x3e;
                  uVar9 = (ulong)ce & 0x3fffffffffffffff;
                  ce._0_8_ = (ulong)ce >> 0x3e | ce._8_8_ << 2;
                  local_98->v[1] = uVar9;
                  ce._8_8_ = ce._8_8_ >> 0x3e;
                  secp256k1_i128_accum_mul(&cd,uVar13,local_68);
                  iVar5 = local_38;
                  psVar3 = local_90;
                  secp256k1_i128_accum_mul(&cd,local_c0,local_38);
                  secp256k1_i128_accum_mul(&ce,local_b8,iVar7);
                  secp256k1_i128_accum_mul(&ce,local_b0,iVar5);
                  lVar1 = (psVar3->modulus).v[3];
                  if (lVar1 != 0) {
                    secp256k1_i128_accum_mul(&cd,lVar1,lVar10);
                    secp256k1_i128_accum_mul(&ce,(psVar3->modulus).v[3],lVar11);
                  }
                  iVar7 = local_78;
                  local_a0->v[2] = (ulong)cd & 0x3fffffffffffffff;
                  cd._0_8_ = (ulong)cd >> 0x3e | cd._8_8_ << 2;
                  cd._8_8_ = cd._8_8_ >> 0x3e;
                  uVar9 = (ulong)ce & 0x3fffffffffffffff;
                  ce._0_8_ = (ulong)ce >> 0x3e | ce._8_8_ << 2;
                  local_98->v[2] = uVar9;
                  ce._8_8_ = ce._8_8_ >> 0x3e;
                  secp256k1_i128_accum_mul(&cd,uVar13,local_78);
                  iVar5 = local_70;
                  secp256k1_i128_accum_mul(&cd,local_c0,local_70);
                  secp256k1_i128_accum_mul(&ce,local_b8,iVar7);
                  secp256k1_i128_accum_mul(&ce,local_b0,iVar5);
                  secp256k1_i128_accum_mul(&cd,(psVar3->modulus).v[4],local_a8);
                  a_00 = local_98;
                  a = local_a0;
                  secp256k1_i128_accum_mul(&ce,(psVar3->modulus).v[4],lVar11);
                  a->v[3] = (ulong)cd & 0x3fffffffffffffff;
                  cd._0_8_ = (ulong)cd >> 0x3e | cd._8_8_ << 2;
                  cd._8_8_ = cd._8_8_ >> 0x3e;
                  uVar13 = (ulong)ce & 0x3fffffffffffffff;
                  ce._0_8_ = (ulong)ce >> 0x3e | ce._8_8_ << 2;
                  a_00->v[3] = uVar13;
                  ce._8_8_ = ce._8_8_ >> 0x3e;
                  iVar7 = secp256k1_i128_to_i64(&cd);
                  a->v[4] = iVar7;
                  iVar7 = secp256k1_i128_to_i64(&ce);
                  a_00->v[4] = iVar7;
                  iVar4 = secp256k1_modinv64_mul_cmp_62(a,5,&psVar3->modulus,-2);
                  if (iVar4 < 1) {
                    pcVar12 = 
                    "test condition failed: secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0"
                    ;
                    uVar8 = 0x1ea;
                  }
                  else {
                    iVar4 = secp256k1_modinv64_mul_cmp_62(a,5,&psVar3->modulus,1);
                    if (iVar4 < 0) {
                      iVar4 = secp256k1_modinv64_mul_cmp_62(a_00,5,&psVar3->modulus,-2);
                      if (iVar4 < 1) {
                        pcVar12 = 
                        "test condition failed: secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0"
                        ;
                        uVar8 = 0x1ec;
                      }
                      else {
                        iVar4 = secp256k1_modinv64_mul_cmp_62(a_00,5,&psVar3->modulus,1);
                        if (iVar4 < 0) {
                          return;
                        }
                        pcVar12 = 
                        "test condition failed: secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0"
                        ;
                        uVar8 = 0x1ed;
                      }
                    }
                    else {
                      pcVar12 = 
                      "test condition failed: secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0"
                      ;
                      uVar8 = 0x1eb;
                    }
                  }
                }
                else {
                  pcVar12 = "test condition failed: (secp256k1_i128_to_u64(&ce) & M62) == 0";
                  uVar8 = 0x1bb;
                }
              }
              else {
                pcVar12 = "test condition failed: (secp256k1_i128_to_u64(&cd) & M62) == 0";
                uVar8 = 0x1ba;
              }
            }
          }
        }
        else {
          pcVar12 = 
          "test condition failed: secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0";
          uVar8 = 0x1a5;
        }
      }
    }
    else {
      pcVar12 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0";
      uVar8 = 0x1a3;
    }
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
          ,uVar8,pcVar12);
  abort();
}

Assistant:

static void secp256k1_modinv64_update_de_62(secp256k1_modinv64_signed62 *d, secp256k1_modinv64_signed62 *e, const secp256k1_modinv64_trans2x2 *t, const secp256k1_modinv64_modinfo* modinfo) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t d0 = d->v[0], d1 = d->v[1], d2 = d->v[2], d3 = d->v[3], d4 = d->v[4];
    const int64_t e0 = e->v[0], e1 = e->v[1], e2 = e->v[2], e3 = e->v[3], e4 = e->v[4];
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t md, me, sd, se;
    secp256k1_int128 cd, ce;
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_abs(u) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(v))); /* |u|+|v| <= 2^62 */
    VERIFY_CHECK(secp256k1_modinv64_abs(q) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(r))); /* |q|+|r| <= 2^62 */

    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d4 >> 63;
    se = e4 >> 63;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    secp256k1_i128_mul(&cd, u, d0);
    secp256k1_i128_accum_mul(&cd, v, e0);
    secp256k1_i128_mul(&ce, q, d0);
    secp256k1_i128_accum_mul(&ce, r, e0);
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 62 zero bottom bits. */
    md -= (modinfo->modulus_inv62 * secp256k1_i128_to_u64(&cd) + md) & M62;
    me -= (modinfo->modulus_inv62 * secp256k1_i128_to_u64(&ce) + me) & M62;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[0], md);
    secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[0], me);
    /* Verify that the low 62 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cd) & M62) == 0); secp256k1_i128_rshift(&cd, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&ce) & M62) == 0); secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 1 of t*[d,e]+modulus*[md,me], and store it as output limb 0 (= down shift). */
    secp256k1_i128_accum_mul(&cd, u, d1);
    secp256k1_i128_accum_mul(&cd, v, e1);
    secp256k1_i128_accum_mul(&ce, q, d1);
    secp256k1_i128_accum_mul(&ce, r, e1);
    if (modinfo->modulus.v[1]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[1], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[1], me);
    }
    d->v[0] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[0] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 2 of t*[d,e]+modulus*[md,me], and store it as output limb 1. */
    secp256k1_i128_accum_mul(&cd, u, d2);
    secp256k1_i128_accum_mul(&cd, v, e2);
    secp256k1_i128_accum_mul(&ce, q, d2);
    secp256k1_i128_accum_mul(&ce, r, e2);
    if (modinfo->modulus.v[2]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[2], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[2], me);
    }
    d->v[1] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[1] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 3 of t*[d,e]+modulus*[md,me], and store it as output limb 2. */
    secp256k1_i128_accum_mul(&cd, u, d3);
    secp256k1_i128_accum_mul(&cd, v, e3);
    secp256k1_i128_accum_mul(&ce, q, d3);
    secp256k1_i128_accum_mul(&ce, r, e3);
    if (modinfo->modulus.v[3]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[3], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[3], me);
    }
    d->v[2] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[2] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 4 of t*[d,e]+modulus*[md,me], and store it as output limb 3. */
    secp256k1_i128_accum_mul(&cd, u, d4);
    secp256k1_i128_accum_mul(&cd, v, e4);
    secp256k1_i128_accum_mul(&ce, q, d4);
    secp256k1_i128_accum_mul(&ce, r, e4);
    secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[4], md);
    secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[4], me);
    d->v[3] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[3] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* What remains is limb 5 of t*[d,e]+modulus*[md,me]; store it as output limb 4. */
    d->v[4] = secp256k1_i128_to_i64(&cd);
    e->v[4] = secp256k1_i128_to_i64(&ce);

    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
}